

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O1

vec3 __thiscall
polyscope::render::backend_openGL_mock::GLAttributeBuffer::getData_vec3
          (GLAttributeBuffer *this,size_t ind)

{
  vec<3,_float,_(glm::qualifier)0> vVar1;
  vec3 vVar2;
  string local_40;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar3;
  
  if ((this->super_AttributeBuffer).dataType != Vector3Float) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"bad getData type","");
    exception(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  vVar1 = getData_helper<glm::vec<3,float,(glm::qualifier)0>>(this,ind);
  vVar2.field_0 = vVar1.field_0;
  vVar2.field_1 = vVar1.field_1;
  register0x00001240 = vVar1.field_2;
  return vVar2;
}

Assistant:

glm::vec3 GLAttributeBuffer::getData_vec3(size_t ind) {
  if (getType() != RenderDataType::Vector3Float) exception("bad getData type");
  return getData_helper<glm::vec3>(ind);
}